

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

string * __thiscall
wabt::anon_unknown_67::BinaryReaderIR::GetUniqueName
          (string *__return_storage_ptr__,BinaryReaderIR *this,BindingHash *bindings,
          string *orig_name)

{
  undefined8 *puVar1;
  __buckets_ptr pp_Var2;
  uint __val;
  uint uVar3;
  uint uVar4;
  size_type sVar5;
  undefined8 *puVar6;
  ulong uVar7;
  pointer pcVar8;
  uint __len;
  undefined8 *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  size_type *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  uint local_34;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pp_Var2 = (bindings->
            super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
            )._M_h._M_buckets;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pp_Var2,
             (bindings->
             super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
             )._M_h._M_bucket_count + (long)pp_Var2);
  local_34 = 1;
  __str_1.field_2._8_8_ = __return_storage_ptr__;
  do {
    sVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
            ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                     *)this,__return_storage_ptr__);
    if (sVar5 == 0) {
      return (string *)0x0;
    }
    pp_Var2 = (bindings->
              super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
              )._M_h._M_buckets;
    local_80 = &__str._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pp_Var2,
               (bindings->
               super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
               )._M_h._M_bucket_count + (long)pp_Var2);
    std::__cxx11::string::append((string *)&local_80,".");
    __val = -local_34;
    if (0 < (int)local_34) {
      __val = local_34;
    }
    __len = 1;
    if (9 < __val) {
      uVar7 = (ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar4 = (uint)uVar7;
        if (uVar4 < 100) {
          __len = __len - 2;
          goto LAB_00f34f3e;
        }
        if (uVar4 < 1000) {
          __len = __len - 1;
          goto LAB_00f34f3e;
        }
        if (uVar4 < 10000) goto LAB_00f34f3e;
        uVar7 = uVar7 / 10000;
        uVar3 = __len + 4;
      } while (99999 < uVar4);
      __len = __len + 1;
    }
LAB_00f34f3e:
    __str.field_2._8_8_ = &__str_1._M_string_length;
    std::__cxx11::string::_M_construct
              ((string *)(__str.field_2._M_local_buf + 8),(ulong)(__len + -((int)local_34 >> 0x1f)),
               '-');
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uint)-((int)local_34 >> 0x1f) + __str.field_2._8_8_),__len,__val);
    __return_storage_ptr__ = (string *)__str_1.field_2._8_8_;
    pcVar8 = (pointer)0xf;
    if (local_80 != &__str._M_string_length) {
      pcVar8 = (pointer)__str._M_string_length;
    }
    if (pcVar8 < __str_1._M_dataplus._M_p + __str._M_dataplus._M_p) {
      pcVar8 = (pointer)0xf;
      if ((size_type *)__str.field_2._8_8_ != &__str_1._M_string_length) {
        pcVar8 = (pointer)__str_1._M_string_length;
      }
      if (pcVar8 < __str_1._M_dataplus._M_p + __str._M_dataplus._M_p) goto LAB_00f34fb7;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((string *)(__str.field_2._M_local_buf + 8),0,0,(char *)local_80,
                          (ulong)__str._M_dataplus._M_p);
    }
    else {
LAB_00f34fb7:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((string *)&local_80,(char *)__str.field_2._8_8_,
                          (ulong)__str_1._M_dataplus._M_p);
    }
    puVar1 = puVar6 + 2;
    if ((undefined8 *)*puVar6 == puVar1) {
      local_90 = *puVar1;
      uStack_88 = puVar6[3];
      local_a0 = &local_90;
    }
    else {
      local_90 = *puVar1;
      local_a0 = (undefined8 *)*puVar6;
    }
    local_98 = puVar6[1];
    *puVar6 = puVar1;
    puVar6[1] = 0;
    *(undefined1 *)puVar1 = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
    if (local_a0 != &local_90) {
      operator_delete(local_a0);
    }
    if ((size_type *)__str.field_2._8_8_ != &__str_1._M_string_length) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    if (local_80 != &__str._M_string_length) {
      operator_delete(local_80);
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

std::string BinaryReaderIR::GetUniqueName(BindingHash* bindings,
                                          const std::string& orig_name) {
  int counter = 1;
  std::string unique_name = orig_name;
  while (bindings->count(unique_name) != 0) {
    unique_name = orig_name + "." + std::to_string(counter++);
  }
  return unique_name;
}